

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O1

Status * __thiscall
draco::PlyDecoder::DecodeFromBuffer
          (Status *__return_storage_ptr__,PlyDecoder *this,DecoderBuffer *buffer,
          PointCloud *out_point_cloud)

{
  this->out_point_cloud_ = out_point_cloud;
  DecoderBuffer::Init(&this->buffer_,buffer->data_ + buffer->pos_,buffer->data_size_ - buffer->pos_)
  ;
  DecodeInternal(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeFromBuffer(DecoderBuffer *buffer,
                                    PointCloud *out_point_cloud) {
  out_point_cloud_ = out_point_cloud;
  buffer_.Init(buffer->data_head(), buffer->remaining_size());
  return DecodeInternal();
}